

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int32 bio_writehdr_version(FILE *fp,char *version)

{
  undefined4 local_1c;
  char *pcStack_18;
  uint32 b;
  char *version_local;
  FILE *fp_local;
  
  pcStack_18 = version;
  version_local = (char *)fp;
  fprintf((FILE *)fp,"s3\n");
  fprintf((FILE *)version_local,"version %s\n",pcStack_18);
  fprintf((FILE *)version_local,"endhdr\n");
  fflush((FILE *)version_local);
  local_1c = 0x11223344;
  fwrite(&local_1c,4,1,(FILE *)version_local);
  fflush((FILE *)version_local);
  return 0;
}

Assistant:

int32
bio_writehdr_version(FILE * fp, char *version)
{
    uint32 b;

    fprintf(fp, "s3\n");
    fprintf(fp, "version %s\n", version);
    fprintf(fp, "endhdr\n");
    fflush(fp);

    b = (uint32) BYTE_ORDER_MAGIC;
    fwrite(&b, sizeof(uint32), 1, fp);
    fflush(fp);

    return 0;
}